

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_FraigPrintSimClasses(Ivy_FraigMan_t *p)

{
  Ivy_Obj_t *pClass;
  uint uVar1;
  Ivy_FraigList_t *pIVar2;
  
  pIVar2 = &p->lClasses;
  while (pClass = pIVar2->pHead, pClass != (Ivy_Obj_t *)0x0) {
    uVar1 = Ivy_FraigCountClassNodes(pClass);
    printf("%d ",(ulong)uVar1);
    pIVar2 = (Ivy_FraigList_t *)&pClass->pPrevFan0;
  }
  return;
}

Assistant:

void Ivy_FraigPrintSimClasses( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pClass;
    Ivy_FraigForEachEquivClass( p->lClasses.pHead, pClass )
    {
//        Ivy_FraigPrintClass( pClass );
        printf( "%d ", Ivy_FraigCountClassNodes( pClass ) );
    }
//    printf( "\n" );
}